

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XML256TableTranscoder.cpp
# Opt level: O1

XMLByte __thiscall
xercesc_4_0::XML256TableTranscoder::xlatOneTo(XML256TableTranscoder *this,XMLCh toXlat)

{
  TransRec *pTVar1;
  bool bVar2;
  XMLByte in_AL;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  pTVar1 = this->fToTable;
  uVar3 = this->fToSize - 1;
  uVar5 = 0;
  while( true ) {
    uVar7 = (uVar3 - uVar5 >> 1) + uVar5;
    bVar2 = true;
    uVar4 = uVar3;
    uVar6 = uVar7;
    if (((ushort)toXlat <= (ushort)pTVar1[uVar7].intCh) &&
       (uVar4 = uVar7, uVar6 = uVar5, (ushort)pTVar1[uVar7].intCh <= (ushort)toXlat)) {
      in_AL = pTVar1[uVar7].extCh;
      bVar2 = false;
      uVar4 = uVar3;
    }
    if (!bVar2) break;
    uVar3 = uVar4;
    uVar5 = uVar6;
    if (uVar4 <= uVar6 + 1) {
      if (pTVar1[uVar4].intCh == toXlat) {
        return pTVar1[uVar4].extCh;
      }
      return '\0';
    }
  }
  return in_AL;
}

Assistant:

XMLByte XML256TableTranscoder::xlatOneTo(const XMLCh toXlat) const
{
    XMLSize_t lowOfs = 0;
    XMLSize_t hiOfs = fToSize - 1;
    do
    {
        // Calc the mid point of the low and high offset.
        const XMLSize_t midOfs = ((hiOfs - lowOfs) / 2) + lowOfs;

        //
        //  If our test char is greater than the mid point char, then
        //  we move up to the upper half. Else we move to the lower
        //  half. If its equal, then its our guy.
        //
        if (toXlat > fToTable[midOfs].intCh)
        {
            lowOfs = midOfs;
        }
         else if (toXlat < fToTable[midOfs].intCh)
        {
            hiOfs = midOfs;
        }
         else
        {
            return fToTable[midOfs].extCh;
        }
    }   while (lowOfs + 1 < hiOfs);

    // Check the high end of the range otherwise the
    // last item in the table may never be found.
        if (toXlat == fToTable[hiOfs].intCh)
        {
            return fToTable[hiOfs].extCh;
        }

    return 0;
}